

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O3

int nn_device_loopback(nn_device_recipe *device,int s)

{
  short sVar1;
  int iVar2;
  int flags;
  undefined1 *optval;
  int s_00;
  int s_01;
  ulong uVar3;
  undefined8 uVar4;
  nn_device_recipe *device_00;
  pollfd *ppVar5;
  size_t *optvallen;
  bool bVar6;
  int op;
  size_t opsz;
  undefined1 auStack_d0 [8];
  undefined1 auStack_c8 [8];
  nn_msghdr nStack_c0;
  nn_iovec nStack_a0;
  ulong uStack_90;
  nn_device_recipe *pnStack_88;
  undefined1 *puStack_80;
  code *pcStack_78;
  pollfd pStack_70;
  undefined4 uStack_68;
  short sStack_64;
  byte bStack_62;
  short sStack_5c;
  byte bStack_5a;
  short sStack_54;
  byte bStack_52;
  ulong uStack_50;
  undefined1 local_1c [4];
  size_t local_18;
  
  optvallen = &local_18;
  local_18 = 4;
  optval = local_1c;
  device_00 = (nn_device_recipe *)(ulong)(uint)s;
  uVar3 = 0;
  iVar2 = nn_getsockopt(s,0,0xc,optval,optvallen);
  if (iVar2 != 0) {
    return -1;
  }
  if (local_18 == 4) {
    nn_device_loopback_cold_2();
    return -1;
  }
  nn_device_loopback_cold_1();
  ppVar5 = &pStack_70;
  pStack_70.events = 1;
  uStack_68 = SUB84(optval,0);
  sStack_64 = 1;
  sStack_5c = 1;
  sStack_54 = 1;
  uVar4 = 4;
  pcStack_78 = (code *)0x124179;
  uStack_50 = (ulong)(uint)s;
  iVar2 = poll(&pStack_70,4,-1);
  sVar1 = sStack_54;
  while( true ) {
    if (iVar2 < 0) {
      return -1;
    }
    s_01 = (int)uVar4;
    flags = (int)optval;
    sStack_54 = sVar1;
    if (iVar2 == 0) break;
    if (((byte)pStack_70.revents & 1) != 0) {
      pStack_70.events = 0;
    }
    if ((bStack_62 & 1) != 0) {
      sStack_64 = 0;
    }
    if ((bStack_5a & 1) != 0) {
      sStack_5c = 0;
    }
    bVar6 = (bStack_52 & 1) != 0;
    if (bVar6) {
      sStack_54 = 0;
    }
    if ((pStack_70.events == 0) && (bVar6 || sVar1 == 0)) {
      optval = (undefined1 *)0x1;
      pcStack_78 = (code *)0x1241ee;
      iVar2 = nn_device_mvmsg(device_00,(int)uVar3,(int)optvallen,1);
      if (iVar2 < 0) {
        return -1;
      }
      pStack_70.events = 1;
      sStack_54 = 1;
    }
    if (sStack_64 == 0 && sStack_5c == 0) {
      optval = (undefined1 *)0x1;
      pcStack_78 = (code *)0x12421b;
      iVar2 = nn_device_mvmsg(device_00,(int)optvallen,(int)uVar3,1);
      if (iVar2 < 0) {
        return -1;
      }
      sStack_5c = 1;
      sStack_64 = 1;
    }
    uVar4 = 4;
    pcStack_78 = (code *)0x12423d;
    ppVar5 = &pStack_70;
    iVar2 = poll(&pStack_70,4,-1);
    sVar1 = sStack_54;
  }
  pcStack_78 = nn_device_mvmsg;
  nn_device_twoway_cold_1();
  nStack_a0.iov_base = auStack_c8;
  nStack_c0.msg_iov = &nStack_a0;
  nStack_a0.iov_len = 0xffffffffffffffff;
  nStack_c0.msg_iovlen = 1;
  nStack_c0._12_4_ = 0;
  nStack_c0.msg_control = auStack_d0;
  nStack_c0.msg_controllen = 0xffffffffffffffff;
  uStack_90 = (ulong)optvallen & 0xffffffff;
  pnStack_88 = device_00;
  puStack_80 = (undefined1 *)&pStack_70;
  pcStack_78 = (code *)(uVar3 & 0xffffffff);
  iVar2 = nn_recvmsg(s_01,&nStack_c0,flags);
  if (-1 < iVar2) {
    iVar2 = (**(code **)((long)ppVar5 + 0x30))(ppVar5,s_01,s_00,flags,&nStack_c0,iVar2);
    if (iVar2 + 1U < 2) {
      return iVar2;
    }
    if (iVar2 != 1) goto LAB_00124337;
    iVar2 = nn_sendmsg(s_00,&nStack_c0,flags);
    if (-1 < iVar2) {
      return 0;
    }
    iVar2 = nn_errno();
    if (iVar2 == 0x9523dfd) {
      return -1;
    }
    nn_device_mvmsg_cold_1();
  }
  iVar2 = nn_errno();
  if (iVar2 == 0x9523dfd) {
    return -1;
  }
  iVar2 = nn_errno();
  if (iVar2 == 9) {
    return -1;
  }
  nn_device_mvmsg_cold_3();
LAB_00124337:
  nn_device_mvmsg_cold_2();
  return -1;
}

Assistant:

int nn_device_loopback (struct nn_device_recipe *device, int s)
{
    int rc;
    int op;
    size_t opsz;

    /*  Check whether the socket is a "raw" socket. */
    opsz = sizeof (op);
    rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_DOMAIN, &op, &opsz);
    if (nn_slow (rc != 0))
        return -1;
    nn_assert (opsz == sizeof (op));
    if (op != AF_SP_RAW) {
        errno = EINVAL;
        return -1;
    }

    for (;;) {
        rc = nn_device_mvmsg (device, s, s, 0);
        if (nn_slow (rc < 0))
            return -1;
    }
}